

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O3

Value * ODDLParser::ValueAllocator::allocPrimData(ValueType type,size_t len)

{
  Value *pVVar1;
  uchar *__s;
  ulong __n;
  
  if (type == ddl_none) {
    return (Value *)0x0;
  }
  if (type == ddl_types_max) {
    return (Value *)0x0;
  }
  pVVar1 = (Value *)operator_new(0x20);
  pVVar1->m_type = type;
  pVVar1->m_size = 0;
  pVVar1->m_data = (uchar *)0x0;
  pVVar1->m_next = (Value *)0x0;
  if (0xc < (uint)type) {
    return pVVar1;
  }
  switch(type) {
  default:
    __n = 1;
    break;
  case ddl_int16:
  case ddl_unsigned_int16:
  case ddl_half:
    __n = 2;
    break;
  case ddl_int32:
  case ddl_unsigned_int32:
  case ddl_float:
    __n = 4;
    break;
  case ddl_int64:
  case ddl_unsigned_int64:
  case ddl_double:
    __n = 8;
    break;
  case ddl_string:
    __n = len + 1;
    pVVar1->m_size = __n;
    if (__n == 0) {
      return pVVar1;
    }
    goto LAB_0066a3f9;
  }
  pVVar1->m_size = __n;
LAB_0066a3f9:
  __s = (uchar *)operator_new__(__n);
  pVVar1->m_data = __s;
  memset(__s,0,__n);
  return pVVar1;
}

Assistant:

Value *ValueAllocator::allocPrimData( Value::ValueType type, size_t len ) {
    if( type == Value::ddl_none || Value::ddl_types_max == type ) {
        return ddl_nullptr;
    }

    Value *data = new Value( type );
    switch( type ) {
        case Value::ddl_bool:
            data->m_size = sizeof( bool );
            break;
        case Value::ddl_int8:
            data->m_size = sizeof( int8 );
            break;
        case Value::ddl_int16:
            data->m_size = sizeof( int16 );
            break;
        case Value::ddl_int32:
            data->m_size = sizeof( int32 );
            break;
        case Value::ddl_int64:
            data->m_size = sizeof( int64 );
            break;
        case Value::ddl_unsigned_int8:
            data->m_size = sizeof( uint8 );
            break;
        case Value::ddl_unsigned_int16:
            data->m_size = sizeof( uint16 );
            break;
        case Value::ddl_unsigned_int32:
            data->m_size = sizeof( uint32 );
            break;
        case Value::ddl_unsigned_int64:
            data->m_size = sizeof( uint64 );
            break;
        case Value::ddl_half:
            data->m_size = sizeof( short );
            break;
        case Value::ddl_float:
            data->m_size = sizeof( float );
            break;
        case Value::ddl_double:
            data->m_size = sizeof( double );
            break;
        case Value::ddl_string:
            data->m_size = sizeof( char )*(len+1);
            break;
        case Value::ddl_ref:
            data->m_size = 0;
            break;
        case Value::ddl_none:
        case Value::ddl_types_max:
        default:
            break;
    }

    if( data->m_size ) {
        data->m_data = new unsigned char[ data->m_size ];
        ::memset(data->m_data,0,data->m_size);
    }

    return data;
}